

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O2

bool __thiscall
MinVR::VRDataIndex::exists(VRDataIndex *this,string *key,string *nameSpace,bool inherit)

{
  iterator iVar1;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)nameSpace);
  iVar1 = _getEntry(this,key,&local_40,inherit);
  std::__cxx11::string::~string((string *)&local_40);
  return (_Rb_tree_header *)iVar1._M_node != &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool exists(const std::string &key,
              const std::string nameSpace = "",
              const bool inherit = true) const {
	  return const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit) != _theIndex.end();
  }